

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

void __thiscall Potassco::TheoryData::reset(TheoryData *this)

{
  void *pvVar1;
  Data *pDVar2;
  
  pvVar1 = (this->data_->terms).mem.beg_;
  std::for_each<Potassco::TheoryTerm*,Potassco::TheoryData::DestroyT>
            (pvVar1,((this->data_->terms).top & 0x7fffffff8) + (long)pvVar1);
  pvVar1 = (this->data_->elems).mem.beg_;
  std::for_each<Potassco::TheoryElement**,Potassco::TheoryData::DestroyT>
            (pvVar1,((this->data_->elems).top & 0x7fffffff8) + (long)pvVar1);
  pvVar1 = (this->data_->atoms).mem.beg_;
  std::for_each<Potassco::TheoryAtom**,Potassco::TheoryData::DestroyT>
            (pvVar1,((this->data_->atoms).top & 0x7fffffff8) + (long)pvVar1);
  Data::RawStack<Potassco::TheoryAtom_*>::reset(&this->data_->atoms);
  Data::RawStack<Potassco::TheoryElement_*>::reset(&this->data_->elems);
  Data::RawStack<Potassco::TheoryTerm>::reset(&this->data_->terms);
  pDVar2 = this->data_;
  (pDVar2->frame).atom = 0;
  (pDVar2->frame).term = 0;
  (pDVar2->frame).elem = 0;
  return;
}

Assistant:

void TheoryData::reset() {
	DestroyT destroy;
	std::for_each(terms(), terms() + numTerms(), destroy);
	std::for_each(elems(), elems() + numElems(), destroy);
	std::for_each(atoms(), atoms() + numAtoms(), destroy);
	data_->atoms.reset();
	data_->elems.reset();
	data_->terms.reset();
	data_->frame = Data::Up();
}